

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::ProcessNoImplicitCallArrayUses
          (GlobOpt *this,RegOpnd *baseOpnd,ArrayRegOpnd *baseArrayOpnd,Instr *instr,
          bool isLikelyJsArray,bool useNoMissingValues)

{
  IRType type;
  StackSym *pSVar1;
  StackSym *this_00;
  undefined1 local_50 [8];
  AutoReuseOpnd autoReuseHeadSegmentLengthOpnd;
  RegOpnd *headSegmentLengthOpnd;
  bool useNoMissingValues_local;
  bool isLikelyJsArray_local;
  Instr *instr_local;
  ArrayRegOpnd *baseArrayOpnd_local;
  RegOpnd *baseOpnd_local;
  GlobOpt *this_local;
  
  if (isLikelyJsArray) {
    CaptureNoImplicitCallUses(this,&baseOpnd->super_Opnd,isLikelyJsArray,(Instr *)0x0);
  }
  else if ((baseArrayOpnd != (ArrayRegOpnd *)0x0) &&
          (pSVar1 = IR::ArrayRegOpnd::HeadSegmentLengthSym(baseArrayOpnd), pSVar1 != (StackSym *)0x0
          )) {
    pSVar1 = IR::ArrayRegOpnd::HeadSegmentLengthSym(baseArrayOpnd);
    this_00 = IR::ArrayRegOpnd::HeadSegmentLengthSym(baseArrayOpnd);
    type = StackSym::GetType(this_00);
    autoReuseHeadSegmentLengthOpnd._16_8_ = IR::RegOpnd::New(pSVar1,type,instr->m_func);
    IR::AutoReuseOpnd::AutoReuseOpnd
              ((AutoReuseOpnd *)local_50,(Opnd *)autoReuseHeadSegmentLengthOpnd._16_8_,instr->m_func
               ,true);
    CaptureNoImplicitCallUses(this,(Opnd *)autoReuseHeadSegmentLengthOpnd._16_8_,false,(Instr *)0x0)
    ;
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_50);
  }
  return;
}

Assistant:

void
GlobOpt::ProcessNoImplicitCallArrayUses(IR::RegOpnd * baseOpnd, IR::ArrayRegOpnd * baseArrayOpnd, IR::Instr * instr, bool isLikelyJsArray, bool useNoMissingValues)
{
    if (isLikelyJsArray)
    {
        // Insert an instruction to indicate to the dead-store pass that implicit calls need to be kept disabled until this
        // instruction. Operations other than LdElem, StElem and IsIn don't benefit much from arrays having no missing values,
        // so no need to ensure that the array still has no missing values. For a particular array, if none of the accesses
        // benefit much from the no-missing-values information, it may be beneficial to avoid checking for no missing
        // values, especially in the case for a single array access, where the cost of the check could be relatively
        // significant. An StElem has to do additional checks in the common path if the array may have missing values, and
        // a StElem that operates on an array that has no missing values is more likely to keep the no-missing-values info
        // on the array more precise, so it still benefits a little from the no-missing-values info.
        this->CaptureNoImplicitCallUses(baseOpnd, isLikelyJsArray);
    }
    else if (baseArrayOpnd && baseArrayOpnd->HeadSegmentLengthSym())
    {
        // A typed array's array buffer may be transferred to a web worker as part of an implicit call, in which case the typed
        // array's length is set to zero. Insert an instruction to indicate to the dead-store pass that implicit calls need to
        // be disabled until this instruction.
        IR::RegOpnd *const headSegmentLengthOpnd =
            IR::RegOpnd::New(
                baseArrayOpnd->HeadSegmentLengthSym(),
                baseArrayOpnd->HeadSegmentLengthSym()->GetType(),
                instr->m_func);

        const IR::AutoReuseOpnd autoReuseHeadSegmentLengthOpnd(headSegmentLengthOpnd, instr->m_func);
        this->CaptureNoImplicitCallUses(headSegmentLengthOpnd, false);
    }
}